

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.cpp
# Opt level: O0

void __thiscall ezc3d::ParametersNS::Parameters::setMandatoryParameters(Parameters *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<double> __l_04;
  initializer_list<int> __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<int> __l_08;
  initializer_list<int> __l_09;
  initializer_list<int> __l_10;
  initializer_list<double> __l_11;
  initializer_list<double> __l_12;
  initializer_list<int> __l_13;
  initializer_list<double> __l_14;
  bool bVar1;
  byte bVar2;
  undefined1 uVar3;
  Group *pGVar4;
  Parameter p_24;
  Parameter p_23;
  Parameter p_22;
  Parameter p_21;
  Parameter p_20;
  Parameter p_19;
  Parameter p_18;
  Group *grp_2;
  Parameter p_17;
  Parameter p_16;
  Parameter p_15;
  Parameter p_14;
  Parameter p_13;
  Parameter p_12;
  Parameter p_11;
  Parameter p_10;
  Parameter p_9;
  Parameter p_8;
  Group *grp_1;
  Parameter p_7;
  Parameter p_6;
  Parameter p_5;
  Parameter p_4;
  Parameter p_3;
  Parameter p_2;
  Parameter p_1;
  Parameter p;
  Group *grp;
  string *in_stack_ffffffffffffd538;
  Parameter *in_stack_ffffffffffffd540;
  Parameter *this_00;
  string *in_stack_ffffffffffffd550;
  string *description;
  Group *in_stack_ffffffffffffd558;
  string *name;
  undefined6 in_stack_ffffffffffffd560;
  undefined1 in_stack_ffffffffffffd566;
  undefined1 in_stack_ffffffffffffd567;
  allocator<char> *in_stack_ffffffffffffd570;
  allocator<char> *__a;
  Parameter *in_stack_ffffffffffffd578;
  Parameter *in_stack_ffffffffffffd580;
  double in_stack_ffffffffffffd5b8;
  int data;
  Parameter *in_stack_ffffffffffffd5c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffd5d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffd5d8;
  undefined6 in_stack_ffffffffffffd5e0;
  undefined1 in_stack_ffffffffffffd5e6;
  undefined1 in_stack_ffffffffffffd5e7;
  undefined1 local_24a8 [47];
  undefined1 local_2479 [40];
  undefined1 local_2451 [216];
  allocator<char> local_2379;
  string local_2378 [32];
  undefined1 local_2358 [40];
  size_type sStack_2330;
  undefined1 local_2328 [31];
  allocator<char> local_2309;
  string local_2308 [39];
  allocator<char> local_22e1;
  string local_22e0 [215];
  allocator<char> local_2209;
  string local_2208 [32];
  undefined8 local_21e8;
  undefined8 uStack_21e0;
  undefined8 local_21d8;
  undefined8 local_21c8;
  undefined8 uStack_21c0;
  undefined8 local_21b8;
  initializer_list<double> local_21b0;
  allocator<char> local_2199;
  string local_2198 [39];
  allocator<char> local_2171;
  string local_2170 [215];
  allocator<char> local_2099;
  string local_2098 [32];
  undefined8 local_2078;
  undefined8 uStack_2070;
  undefined8 local_2068;
  undefined8 local_2058;
  undefined8 uStack_2050;
  undefined8 local_2048;
  initializer_list<double> local_2040;
  allocator<char> local_2029;
  string local_2028 [39];
  allocator<char> local_2001;
  string local_2000 [215];
  allocator<char> local_1f29;
  string local_1f28 [32];
  undefined8 local_1f08;
  undefined8 uStack_1f00;
  undefined8 local_1ef8;
  undefined8 local_1ee8;
  undefined8 uStack_1ee0;
  undefined8 local_1ed8;
  undefined4 local_1ec8;
  undefined4 local_1ec4;
  undefined4 *local_1ec0;
  undefined8 local_1eb8;
  allocator<char> local_1ea9;
  string local_1ea8 [39];
  allocator<char> local_1e81;
  string local_1e80 [215];
  allocator<char> local_1da9;
  string local_1da8 [32];
  undefined8 local_1d88;
  undefined8 uStack_1d80;
  undefined8 local_1d78;
  undefined8 local_1d68;
  undefined8 uStack_1d60;
  undefined8 local_1d58;
  initializer_list<int> local_1d50;
  allocator<char> local_1d39;
  string local_1d38 [39];
  allocator<char> local_1d11;
  string local_1d10 [215];
  allocator<char> local_1c39;
  string local_1c38 [39];
  allocator<char> local_1c11;
  string local_1c10 [39];
  allocator<char> local_1be9;
  string local_1be8 [215];
  allocator<char> local_1b11;
  string local_1b10 [39];
  allocator<char> local_1ae9;
  string local_1ae8 [32];
  Group *local_1ac8;
  allocator<char> local_1ab9;
  string local_1ab8 [39];
  allocator<char> local_1a91;
  string local_1a90 [135];
  allocator<char> local_1a09;
  string local_1a08 [32];
  undefined8 local_19e8;
  undefined8 uStack_19e0;
  undefined8 local_19d8;
  undefined8 local_19c8;
  undefined8 uStack_19c0;
  undefined8 local_19b8;
  initializer_list<int> local_19b0;
  allocator<char> local_1999;
  string local_1998 [39];
  allocator<char> local_1971;
  string local_1970 [215];
  allocator<char> local_1899;
  string local_1898 [32];
  undefined8 local_1878;
  undefined8 uStack_1870;
  undefined8 local_1868;
  undefined8 local_1858;
  undefined8 uStack_1850;
  undefined8 local_1848;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1838;
  allocator<char> local_1821;
  string local_1820 [39];
  allocator<char> local_17f9;
  string local_17f8 [215];
  allocator<char> local_1721;
  string local_1720 [39];
  allocator<char> local_16f9;
  string local_16f8 [39];
  allocator<char> local_16d1;
  string local_16d0 [32];
  Parameter local_16b0;
  allocator<char> local_15f9;
  string local_15f8 [32];
  undefined8 local_15d8;
  undefined8 uStack_15d0;
  undefined8 local_15c8;
  undefined8 local_15b8;
  undefined8 uStack_15b0;
  undefined8 local_15a8;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_15a0;
  allocator<char> local_1589;
  string local_1588 [39];
  allocator<char> local_1561;
  string local_1560 [215];
  allocator<char> local_1489;
  string local_1488 [32];
  undefined8 local_1468;
  undefined8 uStack_1460;
  undefined8 local_1458;
  undefined8 local_1448;
  undefined8 uStack_1440;
  undefined8 local_1438;
  initializer_list<int> local_1430;
  allocator<char> local_1419;
  string local_1418 [39];
  allocator<char> local_13f1;
  string local_13f0 [215];
  allocator<char> local_1319;
  string local_1318 [32];
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined8 local_12e8;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  undefined8 local_12c8;
  initializer_list<double> local_12b8;
  allocator<char> local_12a1;
  string local_12a0 [39];
  allocator<char> local_1279;
  string local_1278 [215];
  allocator<char> local_11a1;
  string local_11a0 [39];
  allocator<char> local_1179;
  string local_1178 [39];
  allocator<char> local_1151;
  string local_1150 [215];
  allocator<char> local_1079;
  string local_1078 [32];
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1020;
  allocator<char> local_1009;
  string local_1008 [39];
  allocator<char> local_fe1;
  string local_fe0 [215];
  allocator<char> local_f09;
  string local_f08 [32];
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ea8;
  allocator<char> local_e91;
  string local_e90 [39];
  allocator<char> local_e69;
  string local_e68 [215];
  allocator<char> local_d91;
  string local_d90 [39];
  allocator<char> local_d69;
  string local_d68 [39];
  allocator<char> local_d41;
  string local_d40 [32];
  Parameter local_d20;
  allocator<char> local_c69;
  string local_c68 [39];
  allocator<char> local_c41;
  string local_c40 [32];
  Group *local_c20;
  allocator<char> local_c11;
  string local_c10 [39];
  allocator<char> local_be9;
  string local_be8 [135];
  allocator<char> local_b61;
  string local_b60 [39];
  allocator<char> local_b39;
  string local_b38 [39];
  allocator<char> local_b11;
  string local_b10 [32];
  Parameter local_af0;
  allocator<char> local_a39;
  string local_a38 [39];
  allocator<char> local_a11;
  string local_a10 [39];
  allocator<char> local_9e9;
  string local_9e8 [32];
  Parameter local_9c8;
  allocator<char> local_911;
  string local_910 [39];
  allocator<char> local_8e9;
  string local_8e8 [39];
  allocator<char> local_8c1;
  string local_8c0 [32];
  Parameter local_8a0;
  allocator<char> local_7e9;
  string local_7e8 [32];
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_788;
  allocator<char> local_771;
  string local_770 [39];
  allocator<char> local_749;
  string local_748 [215];
  allocator<char> local_671;
  string local_670 [39];
  allocator<char> local_649;
  string local_648 [39];
  allocator<char> local_621;
  string local_620 [32];
  Parameter local_600;
  allocator<char> local_549;
  string local_548 [32];
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4f0;
  allocator<char> local_4d9;
  string local_4d8 [39];
  allocator<char> local_4b1;
  string local_4b0 [215];
  allocator<char> local_3d9;
  string local_3d8 [32];
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_380;
  allocator<char> local_369;
  string local_368 [39];
  allocator<char> local_341;
  string local_340 [215];
  allocator<char> local_269;
  string local_268 [39];
  allocator<char> local_241;
  string local_240 [39];
  allocator<char> local_219;
  string local_218 [32];
  Parameter local_1f8;
  allocator<char> local_141;
  string local_140 [39];
  allocator<char> local_119;
  string local_118 [32];
  Group *local_f8;
  allocator<char> local_e9;
  string local_e8 [39];
  allocator<char> local_c1;
  string local_c0 [151];
  allocator<char> local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
             in_stack_ffffffffffffd570);
  bVar1 = isGroup((Parameters *)in_stack_ffffffffffffd558,in_stack_ffffffffffffd550);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    GroupNS::Group::Group
              ((Group *)CONCAT17(in_stack_ffffffffffffd567,
                                 CONCAT16(in_stack_ffffffffffffd566,in_stack_ffffffffffffd560)),
               &in_stack_ffffffffffffd558->_name,in_stack_ffffffffffffd550);
    group((Parameters *)in_stack_ffffffffffffd580,(Group *)in_stack_ffffffffffffd578);
    GroupNS::Group::~Group((Group *)in_stack_ffffffffffffd540);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator(&local_e9);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator(&local_c1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
             in_stack_ffffffffffffd570);
  pGVar4 = group((Parameters *)in_stack_ffffffffffffd540,in_stack_ffffffffffffd538);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  local_f8 = pGVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
             in_stack_ffffffffffffd570);
  bVar1 = GroupNS::Group::isParameter(in_stack_ffffffffffffd558,in_stack_ffffffffffffd550);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator(&local_141);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    GroupNS::Parameter::Parameter
              ((Parameter *)
               CONCAT17(in_stack_ffffffffffffd567,
                        CONCAT16(in_stack_ffffffffffffd566,in_stack_ffffffffffffd560)),
               &in_stack_ffffffffffffd558->_name,in_stack_ffffffffffffd550);
    std::__cxx11::string::~string(local_240);
    std::allocator<char>::~allocator(&local_241);
    std::__cxx11::string::~string(local_218);
    std::allocator<char>::~allocator(&local_219);
    GroupNS::Parameter::set
              (in_stack_ffffffffffffd5c0,(int)((ulong)in_stack_ffffffffffffd5b8 >> 0x20));
    GroupNS::Parameter::lock(&local_1f8);
    GroupNS::Group::parameter((Group *)in_stack_ffffffffffffd580,in_stack_ffffffffffffd578);
    GroupNS::Parameter::~Parameter(in_stack_ffffffffffffd540);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
             in_stack_ffffffffffffd570);
  bVar1 = GroupNS::Group::isParameter(in_stack_ffffffffffffd558,in_stack_ffffffffffffd550);
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator(&local_269);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    GroupNS::Parameter::Parameter
              ((Parameter *)
               CONCAT17(in_stack_ffffffffffffd567,
                        CONCAT16(in_stack_ffffffffffffd566,in_stack_ffffffffffffd560)),
               &in_stack_ffffffffffffd558->_name,in_stack_ffffffffffffd550);
    std::__cxx11::string::~string(local_368);
    std::allocator<char>::~allocator(&local_369);
    std::__cxx11::string::~string(local_340);
    std::allocator<char>::~allocator(&local_341);
    std::
    initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::initializer_list(&local_380);
    local_398 = 0;
    uStack_390 = 0;
    local_388 = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x169a68);
    __l._M_len._0_6_ = in_stack_ffffffffffffd560;
    __l._M_array = &in_stack_ffffffffffffd558->_name;
    __l._M_len._6_1_ = in_stack_ffffffffffffd566;
    __l._M_len._7_1_ = in_stack_ffffffffffffd567;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffd550,__l);
    local_3b8 = 0;
    uStack_3b0 = 0;
    local_3a8 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x169abb);
    GroupNS::Parameter::set
              ((Parameter *)
               CONCAT17(in_stack_ffffffffffffd5e7,
                        CONCAT16(in_stack_ffffffffffffd5e6,in_stack_ffffffffffffd5e0)),
               in_stack_ffffffffffffd5d8,in_stack_ffffffffffffd5d0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffd550);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffd550);
    GroupNS::Group::parameter((Group *)in_stack_ffffffffffffd580,in_stack_ffffffffffffd578);
    GroupNS::Parameter::~Parameter(in_stack_ffffffffffffd540);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
             in_stack_ffffffffffffd570);
  bVar1 = GroupNS::Group::isParameter(in_stack_ffffffffffffd558,in_stack_ffffffffffffd550);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    GroupNS::Parameter::Parameter
              ((Parameter *)
               CONCAT17(in_stack_ffffffffffffd567,
                        CONCAT16(in_stack_ffffffffffffd566,in_stack_ffffffffffffd560)),
               &in_stack_ffffffffffffd558->_name,in_stack_ffffffffffffd550);
    std::__cxx11::string::~string(local_4d8);
    std::allocator<char>::~allocator(&local_4d9);
    std::__cxx11::string::~string(local_4b0);
    std::allocator<char>::~allocator(&local_4b1);
    std::
    initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::initializer_list(&local_4f0);
    local_508 = 0;
    uStack_500 = 0;
    local_4f8 = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x169dd8);
    __l_00._M_len._0_6_ = in_stack_ffffffffffffd560;
    __l_00._M_array = &in_stack_ffffffffffffd558->_name;
    __l_00._M_len._6_1_ = in_stack_ffffffffffffd566;
    __l_00._M_len._7_1_ = in_stack_ffffffffffffd567;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffd550,__l_00);
    local_528 = 0;
    uStack_520 = 0;
    local_518 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x169e2b);
    GroupNS::Parameter::set
              ((Parameter *)
               CONCAT17(in_stack_ffffffffffffd5e7,
                        CONCAT16(in_stack_ffffffffffffd5e6,in_stack_ffffffffffffd5e0)),
               in_stack_ffffffffffffd5d8,in_stack_ffffffffffffd5d0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffd550);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffd550);
    GroupNS::Group::parameter((Group *)in_stack_ffffffffffffd580,in_stack_ffffffffffffd578);
    GroupNS::Parameter::~Parameter(in_stack_ffffffffffffd540);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
             in_stack_ffffffffffffd570);
  bVar1 = GroupNS::Group::isParameter(in_stack_ffffffffffffd558,in_stack_ffffffffffffd550);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator(&local_549);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    GroupNS::Parameter::Parameter
              ((Parameter *)
               CONCAT17(in_stack_ffffffffffffd567,
                        CONCAT16(in_stack_ffffffffffffd566,in_stack_ffffffffffffd560)),
               &in_stack_ffffffffffffd558->_name,in_stack_ffffffffffffd550);
    std::__cxx11::string::~string(local_648);
    std::allocator<char>::~allocator(&local_649);
    std::__cxx11::string::~string(local_620);
    std::allocator<char>::~allocator(&local_621);
    GroupNS::Parameter::set(in_stack_ffffffffffffd5c0,in_stack_ffffffffffffd5b8);
    GroupNS::Parameter::lock(&local_600);
    GroupNS::Group::parameter((Group *)in_stack_ffffffffffffd580,in_stack_ffffffffffffd578);
    GroupNS::Parameter::~Parameter(in_stack_ffffffffffffd540);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
             in_stack_ffffffffffffd570);
  bVar1 = GroupNS::Group::isParameter(in_stack_ffffffffffffd558,in_stack_ffffffffffffd550);
  std::__cxx11::string::~string(local_670);
  std::allocator<char>::~allocator(&local_671);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    GroupNS::Parameter::Parameter
              ((Parameter *)
               CONCAT17(in_stack_ffffffffffffd567,
                        CONCAT16(in_stack_ffffffffffffd566,in_stack_ffffffffffffd560)),
               &in_stack_ffffffffffffd558->_name,in_stack_ffffffffffffd550);
    std::__cxx11::string::~string(local_770);
    std::allocator<char>::~allocator(&local_771);
    std::__cxx11::string::~string(local_748);
    std::allocator<char>::~allocator(&local_749);
    std::
    initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::initializer_list(&local_788);
    local_7a8 = 0;
    uStack_7a0 = 0;
    local_798 = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x16a3d3);
    __l_01._M_len._0_6_ = in_stack_ffffffffffffd560;
    __l_01._M_array = &in_stack_ffffffffffffd558->_name;
    __l_01._M_len._6_1_ = in_stack_ffffffffffffd566;
    __l_01._M_len._7_1_ = in_stack_ffffffffffffd567;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffd550,__l_01);
    local_7c8 = 0;
    uStack_7c0 = 0;
    local_7b8 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x16a426);
    GroupNS::Parameter::set
              ((Parameter *)
               CONCAT17(in_stack_ffffffffffffd5e7,
                        CONCAT16(in_stack_ffffffffffffd5e6,in_stack_ffffffffffffd5e0)),
               in_stack_ffffffffffffd5d8,in_stack_ffffffffffffd5d0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffd550);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffd550);
    GroupNS::Group::parameter((Group *)in_stack_ffffffffffffd580,in_stack_ffffffffffffd578);
    GroupNS::Parameter::~Parameter(in_stack_ffffffffffffd540);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
             in_stack_ffffffffffffd570);
  bVar1 = GroupNS::Group::isParameter(in_stack_ffffffffffffd558,in_stack_ffffffffffffd550);
  std::__cxx11::string::~string(local_7e8);
  std::allocator<char>::~allocator(&local_7e9);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    GroupNS::Parameter::Parameter
              ((Parameter *)
               CONCAT17(in_stack_ffffffffffffd567,
                        CONCAT16(in_stack_ffffffffffffd566,in_stack_ffffffffffffd560)),
               &in_stack_ffffffffffffd558->_name,in_stack_ffffffffffffd550);
    std::__cxx11::string::~string(local_8e8);
    std::allocator<char>::~allocator(&local_8e9);
    std::__cxx11::string::~string(local_8c0);
    std::allocator<char>::~allocator(&local_8c1);
    GroupNS::Parameter::set(in_stack_ffffffffffffd5c0,in_stack_ffffffffffffd5b8);
    GroupNS::Parameter::lock(&local_8a0);
    GroupNS::Group::parameter((Group *)in_stack_ffffffffffffd580,in_stack_ffffffffffffd578);
    GroupNS::Parameter::~Parameter(in_stack_ffffffffffffd540);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
             in_stack_ffffffffffffd570);
  bVar1 = GroupNS::Group::isParameter(in_stack_ffffffffffffd558,in_stack_ffffffffffffd550);
  std::__cxx11::string::~string(local_910);
  std::allocator<char>::~allocator(&local_911);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    GroupNS::Parameter::Parameter
              ((Parameter *)
               CONCAT17(in_stack_ffffffffffffd567,
                        CONCAT16(in_stack_ffffffffffffd566,in_stack_ffffffffffffd560)),
               &in_stack_ffffffffffffd558->_name,in_stack_ffffffffffffd550);
    std::__cxx11::string::~string(local_a10);
    std::allocator<char>::~allocator(&local_a11);
    std::__cxx11::string::~string(local_9e8);
    std::allocator<char>::~allocator(&local_9e9);
    GroupNS::Parameter::set
              (in_stack_ffffffffffffd5c0,(int)((ulong)in_stack_ffffffffffffd5b8 >> 0x20));
    GroupNS::Parameter::lock(&local_9c8);
    GroupNS::Group::parameter((Group *)in_stack_ffffffffffffd580,in_stack_ffffffffffffd578);
    GroupNS::Parameter::~Parameter(in_stack_ffffffffffffd540);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
             in_stack_ffffffffffffd570);
  bVar1 = GroupNS::Group::isParameter(in_stack_ffffffffffffd558,in_stack_ffffffffffffd550);
  std::__cxx11::string::~string(local_a38);
  std::allocator<char>::~allocator(&local_a39);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    GroupNS::Parameter::Parameter
              ((Parameter *)
               CONCAT17(in_stack_ffffffffffffd567,
                        CONCAT16(in_stack_ffffffffffffd566,in_stack_ffffffffffffd560)),
               &in_stack_ffffffffffffd558->_name,in_stack_ffffffffffffd550);
    std::__cxx11::string::~string(local_b38);
    std::allocator<char>::~allocator(&local_b39);
    std::__cxx11::string::~string(local_b10);
    std::allocator<char>::~allocator(&local_b11);
    GroupNS::Parameter::set
              (in_stack_ffffffffffffd5c0,(int)((ulong)in_stack_ffffffffffffd5b8 >> 0x20));
    GroupNS::Parameter::lock(&local_af0);
    GroupNS::Group::parameter((Group *)in_stack_ffffffffffffd580,in_stack_ffffffffffffd578);
    GroupNS::Parameter::~Parameter(in_stack_ffffffffffffd540);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
             in_stack_ffffffffffffd570);
  bVar1 = isGroup((Parameters *)in_stack_ffffffffffffd558,in_stack_ffffffffffffd550);
  std::__cxx11::string::~string(local_b60);
  std::allocator<char>::~allocator(&local_b61);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    GroupNS::Group::Group
              ((Group *)CONCAT17(in_stack_ffffffffffffd567,
                                 CONCAT16(in_stack_ffffffffffffd566,in_stack_ffffffffffffd560)),
               &in_stack_ffffffffffffd558->_name,in_stack_ffffffffffffd550);
    group((Parameters *)in_stack_ffffffffffffd580,(Group *)in_stack_ffffffffffffd578);
    GroupNS::Group::~Group((Group *)in_stack_ffffffffffffd540);
    std::__cxx11::string::~string(local_c10);
    std::allocator<char>::~allocator(&local_c11);
    std::__cxx11::string::~string(local_be8);
    std::allocator<char>::~allocator(&local_be9);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
             in_stack_ffffffffffffd570);
  pGVar4 = group((Parameters *)in_stack_ffffffffffffd540,in_stack_ffffffffffffd538);
  std::__cxx11::string::~string(local_c40);
  std::allocator<char>::~allocator(&local_c41);
  local_c20 = pGVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
             in_stack_ffffffffffffd570);
  bVar1 = GroupNS::Group::isParameter(in_stack_ffffffffffffd558,in_stack_ffffffffffffd550);
  std::__cxx11::string::~string(local_c68);
  std::allocator<char>::~allocator(&local_c69);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    GroupNS::Parameter::Parameter
              ((Parameter *)
               CONCAT17(in_stack_ffffffffffffd567,
                        CONCAT16(in_stack_ffffffffffffd566,in_stack_ffffffffffffd560)),
               &in_stack_ffffffffffffd558->_name,in_stack_ffffffffffffd550);
    std::__cxx11::string::~string(local_d68);
    std::allocator<char>::~allocator(&local_d69);
    std::__cxx11::string::~string(local_d40);
    std::allocator<char>::~allocator(&local_d41);
    GroupNS::Parameter::set
              (in_stack_ffffffffffffd5c0,(int)((ulong)in_stack_ffffffffffffd5b8 >> 0x20));
    GroupNS::Parameter::lock(&local_d20);
    GroupNS::Group::parameter((Group *)in_stack_ffffffffffffd580,in_stack_ffffffffffffd578);
    GroupNS::Parameter::~Parameter(in_stack_ffffffffffffd540);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
             in_stack_ffffffffffffd570);
  bVar1 = GroupNS::Group::isParameter(in_stack_ffffffffffffd558,in_stack_ffffffffffffd550);
  std::__cxx11::string::~string(local_d90);
  std::allocator<char>::~allocator(&local_d91);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    GroupNS::Parameter::Parameter
              ((Parameter *)
               CONCAT17(in_stack_ffffffffffffd567,
                        CONCAT16(in_stack_ffffffffffffd566,in_stack_ffffffffffffd560)),
               &in_stack_ffffffffffffd558->_name,in_stack_ffffffffffffd550);
    std::__cxx11::string::~string(local_e90);
    std::allocator<char>::~allocator(&local_e91);
    std::__cxx11::string::~string(local_e68);
    std::allocator<char>::~allocator(&local_e69);
    std::
    initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::initializer_list(&local_ea8);
    local_ec8 = 0;
    uStack_ec0 = 0;
    local_eb8 = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x16b46f);
    __l_02._M_len._0_6_ = in_stack_ffffffffffffd560;
    __l_02._M_array = &in_stack_ffffffffffffd558->_name;
    __l_02._M_len._6_1_ = in_stack_ffffffffffffd566;
    __l_02._M_len._7_1_ = in_stack_ffffffffffffd567;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffd550,__l_02);
    local_ee8 = 0;
    uStack_ee0 = 0;
    local_ed8 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x16b4c2);
    GroupNS::Parameter::set
              ((Parameter *)
               CONCAT17(in_stack_ffffffffffffd5e7,
                        CONCAT16(in_stack_ffffffffffffd5e6,in_stack_ffffffffffffd5e0)),
               in_stack_ffffffffffffd5d8,in_stack_ffffffffffffd5d0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffd550);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffd550);
    GroupNS::Group::parameter((Group *)in_stack_ffffffffffffd580,in_stack_ffffffffffffd578);
    GroupNS::Parameter::~Parameter(in_stack_ffffffffffffd540);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
             in_stack_ffffffffffffd570);
  bVar1 = GroupNS::Group::isParameter(in_stack_ffffffffffffd558,in_stack_ffffffffffffd550);
  std::__cxx11::string::~string(local_f08);
  std::allocator<char>::~allocator(&local_f09);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    GroupNS::Parameter::Parameter
              ((Parameter *)
               CONCAT17(in_stack_ffffffffffffd567,
                        CONCAT16(in_stack_ffffffffffffd566,in_stack_ffffffffffffd560)),
               &in_stack_ffffffffffffd558->_name,in_stack_ffffffffffffd550);
    std::__cxx11::string::~string(local_1008);
    std::allocator<char>::~allocator(&local_1009);
    std::__cxx11::string::~string(local_fe0);
    std::allocator<char>::~allocator(&local_fe1);
    std::
    initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::initializer_list(&local_1020);
    local_1038 = 0;
    uStack_1030 = 0;
    local_1028 = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x16b7df);
    __l_03._M_len._0_6_ = in_stack_ffffffffffffd560;
    __l_03._M_array = &in_stack_ffffffffffffd558->_name;
    __l_03._M_len._6_1_ = in_stack_ffffffffffffd566;
    __l_03._M_len._7_1_ = in_stack_ffffffffffffd567;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffd550,__l_03);
    local_1058 = 0;
    uStack_1050 = 0;
    local_1048 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x16b832);
    GroupNS::Parameter::set
              ((Parameter *)
               CONCAT17(in_stack_ffffffffffffd5e7,
                        CONCAT16(in_stack_ffffffffffffd5e6,in_stack_ffffffffffffd5e0)),
               in_stack_ffffffffffffd5d8,in_stack_ffffffffffffd5d0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffd550);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffd550);
    GroupNS::Group::parameter((Group *)in_stack_ffffffffffffd580,in_stack_ffffffffffffd578);
    GroupNS::Parameter::~Parameter(in_stack_ffffffffffffd540);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
             in_stack_ffffffffffffd570);
  bVar1 = GroupNS::Group::isParameter(in_stack_ffffffffffffd558,in_stack_ffffffffffffd550);
  std::__cxx11::string::~string(local_1078);
  std::allocator<char>::~allocator(&local_1079);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    GroupNS::Parameter::Parameter
              ((Parameter *)
               CONCAT17(in_stack_ffffffffffffd567,
                        CONCAT16(in_stack_ffffffffffffd566,in_stack_ffffffffffffd560)),
               &in_stack_ffffffffffffd558->_name,in_stack_ffffffffffffd550);
    std::__cxx11::string::~string(local_1178);
    std::allocator<char>::~allocator(&local_1179);
    std::__cxx11::string::~string(local_1150);
    std::allocator<char>::~allocator(&local_1151);
    GroupNS::Parameter::set(in_stack_ffffffffffffd5c0,in_stack_ffffffffffffd5b8);
    GroupNS::Group::parameter((Group *)in_stack_ffffffffffffd580,in_stack_ffffffffffffd578);
    GroupNS::Parameter::~Parameter(in_stack_ffffffffffffd540);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
             in_stack_ffffffffffffd570);
  bVar1 = GroupNS::Group::isParameter(in_stack_ffffffffffffd558,in_stack_ffffffffffffd550);
  std::__cxx11::string::~string(local_11a0);
  std::allocator<char>::~allocator(&local_11a1);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    GroupNS::Parameter::Parameter
              ((Parameter *)
               CONCAT17(in_stack_ffffffffffffd567,
                        CONCAT16(in_stack_ffffffffffffd566,in_stack_ffffffffffffd560)),
               &in_stack_ffffffffffffd558->_name,in_stack_ffffffffffffd550);
    std::__cxx11::string::~string(local_12a0);
    std::allocator<char>::~allocator(&local_12a1);
    std::__cxx11::string::~string(local_1278);
    std::allocator<char>::~allocator(&local_1279);
    std::initializer_list<double>::initializer_list(&local_12b8);
    local_12d8 = 0;
    uStack_12d0 = 0;
    local_12c8 = 0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x16bdcb);
    __l_04._M_len._0_6_ = in_stack_ffffffffffffd560;
    __l_04._M_array = (iterator)in_stack_ffffffffffffd558;
    __l_04._M_len._6_1_ = in_stack_ffffffffffffd566;
    __l_04._M_len._7_1_ = in_stack_ffffffffffffd567;
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd550,__l_04);
    local_12f8 = 0;
    uStack_12f0 = 0;
    local_12e8 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x16be1e);
    GroupNS::Parameter::set
              (in_stack_ffffffffffffd580,
               (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd578,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffd570);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffd550);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd550);
    GroupNS::Group::parameter((Group *)in_stack_ffffffffffffd580,in_stack_ffffffffffffd578);
    GroupNS::Parameter::~Parameter(in_stack_ffffffffffffd540);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
             in_stack_ffffffffffffd570);
  bVar1 = GroupNS::Group::isParameter(in_stack_ffffffffffffd558,in_stack_ffffffffffffd550);
  std::__cxx11::string::~string(local_1318);
  std::allocator<char>::~allocator(&local_1319);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    GroupNS::Parameter::Parameter
              ((Parameter *)
               CONCAT17(in_stack_ffffffffffffd567,
                        CONCAT16(in_stack_ffffffffffffd566,in_stack_ffffffffffffd560)),
               &in_stack_ffffffffffffd558->_name,in_stack_ffffffffffffd550);
    std::__cxx11::string::~string(local_1418);
    std::allocator<char>::~allocator(&local_1419);
    std::__cxx11::string::~string(local_13f0);
    std::allocator<char>::~allocator(&local_13f1);
    std::initializer_list<int>::initializer_list(&local_1430);
    local_1448 = 0;
    uStack_1440 = 0;
    local_1438 = 0;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x16c13b);
    __l_05._M_len._0_6_ = in_stack_ffffffffffffd560;
    __l_05._M_array = (iterator)in_stack_ffffffffffffd558;
    __l_05._M_len._6_1_ = in_stack_ffffffffffffd566;
    __l_05._M_len._7_1_ = in_stack_ffffffffffffd567;
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd550,__l_05);
    local_1468 = 0;
    uStack_1460 = 0;
    local_1458 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x16c18e);
    GroupNS::Parameter::set
              (in_stack_ffffffffffffd580,
               (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd578,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffd570);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffd550);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd550);
    GroupNS::Group::parameter((Group *)in_stack_ffffffffffffd580,in_stack_ffffffffffffd578);
    GroupNS::Parameter::~Parameter(in_stack_ffffffffffffd540);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
             in_stack_ffffffffffffd570);
  bVar1 = GroupNS::Group::isParameter(in_stack_ffffffffffffd558,in_stack_ffffffffffffd550);
  std::__cxx11::string::~string(local_1488);
  std::allocator<char>::~allocator(&local_1489);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    GroupNS::Parameter::Parameter
              ((Parameter *)
               CONCAT17(in_stack_ffffffffffffd567,
                        CONCAT16(in_stack_ffffffffffffd566,in_stack_ffffffffffffd560)),
               &in_stack_ffffffffffffd558->_name,in_stack_ffffffffffffd550);
    std::__cxx11::string::~string(local_1588);
    std::allocator<char>::~allocator(&local_1589);
    std::__cxx11::string::~string(local_1560);
    std::allocator<char>::~allocator(&local_1561);
    std::
    initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::initializer_list(&local_15a0);
    local_15b8 = 0;
    uStack_15b0 = 0;
    local_15a8 = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x16c4ab);
    __l_06._M_len._0_6_ = in_stack_ffffffffffffd560;
    __l_06._M_array = &in_stack_ffffffffffffd558->_name;
    __l_06._M_len._6_1_ = in_stack_ffffffffffffd566;
    __l_06._M_len._7_1_ = in_stack_ffffffffffffd567;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffd550,__l_06);
    local_15d8 = 0;
    uStack_15d0 = 0;
    local_15c8 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x16c4fe);
    GroupNS::Parameter::set
              ((Parameter *)
               CONCAT17(in_stack_ffffffffffffd5e7,
                        CONCAT16(in_stack_ffffffffffffd5e6,in_stack_ffffffffffffd5e0)),
               in_stack_ffffffffffffd5d8,in_stack_ffffffffffffd5d0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffd550);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffd550);
    GroupNS::Group::parameter((Group *)in_stack_ffffffffffffd580,in_stack_ffffffffffffd578);
    GroupNS::Parameter::~Parameter(in_stack_ffffffffffffd540);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
             in_stack_ffffffffffffd570);
  bVar1 = GroupNS::Group::isParameter(in_stack_ffffffffffffd558,in_stack_ffffffffffffd550);
  std::__cxx11::string::~string(local_15f8);
  std::allocator<char>::~allocator(&local_15f9);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    GroupNS::Parameter::Parameter
              ((Parameter *)
               CONCAT17(in_stack_ffffffffffffd567,
                        CONCAT16(in_stack_ffffffffffffd566,in_stack_ffffffffffffd560)),
               &in_stack_ffffffffffffd558->_name,in_stack_ffffffffffffd550);
    std::__cxx11::string::~string(local_16f8);
    std::allocator<char>::~allocator(&local_16f9);
    std::__cxx11::string::~string(local_16d0);
    std::allocator<char>::~allocator(&local_16d1);
    GroupNS::Parameter::set(in_stack_ffffffffffffd5c0,in_stack_ffffffffffffd5b8);
    GroupNS::Parameter::lock(&local_16b0);
    GroupNS::Group::parameter((Group *)in_stack_ffffffffffffd580,in_stack_ffffffffffffd578);
    GroupNS::Parameter::~Parameter(in_stack_ffffffffffffd540);
  }
  data = (int)((ulong)in_stack_ffffffffffffd5b8 >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
             in_stack_ffffffffffffd570);
  bVar1 = GroupNS::Group::isParameter(in_stack_ffffffffffffd558,in_stack_ffffffffffffd550);
  std::__cxx11::string::~string(local_1720);
  std::allocator<char>::~allocator(&local_1721);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    GroupNS::Parameter::Parameter
              ((Parameter *)
               CONCAT17(in_stack_ffffffffffffd567,
                        CONCAT16(in_stack_ffffffffffffd566,in_stack_ffffffffffffd560)),
               &in_stack_ffffffffffffd558->_name,in_stack_ffffffffffffd550);
    std::__cxx11::string::~string(local_1820);
    std::allocator<char>::~allocator(&local_1821);
    std::__cxx11::string::~string(local_17f8);
    std::allocator<char>::~allocator(&local_17f9);
    std::
    initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::initializer_list(&local_1838);
    local_1858 = 0;
    uStack_1850 = 0;
    local_1848 = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x16caa1);
    __l_07._M_len._0_6_ = in_stack_ffffffffffffd560;
    __l_07._M_array = &in_stack_ffffffffffffd558->_name;
    __l_07._M_len._6_1_ = in_stack_ffffffffffffd566;
    __l_07._M_len._7_1_ = in_stack_ffffffffffffd567;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffd550,__l_07);
    local_1878 = 0;
    uStack_1870 = 0;
    local_1868 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x16caf4);
    GroupNS::Parameter::set
              ((Parameter *)
               CONCAT17(in_stack_ffffffffffffd5e7,
                        CONCAT16(in_stack_ffffffffffffd5e6,in_stack_ffffffffffffd5e0)),
               in_stack_ffffffffffffd5d8,in_stack_ffffffffffffd5d0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffd550);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffd550);
    GroupNS::Group::parameter((Group *)in_stack_ffffffffffffd580,in_stack_ffffffffffffd578);
    GroupNS::Parameter::~Parameter(in_stack_ffffffffffffd540);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
             in_stack_ffffffffffffd570);
  bVar1 = GroupNS::Group::isParameter(in_stack_ffffffffffffd558,in_stack_ffffffffffffd550);
  std::__cxx11::string::~string(local_1898);
  std::allocator<char>::~allocator(&local_1899);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    GroupNS::Parameter::Parameter
              ((Parameter *)
               CONCAT17(in_stack_ffffffffffffd567,
                        CONCAT16(in_stack_ffffffffffffd566,in_stack_ffffffffffffd560)),
               &in_stack_ffffffffffffd558->_name,in_stack_ffffffffffffd550);
    std::__cxx11::string::~string(local_1998);
    std::allocator<char>::~allocator(&local_1999);
    std::__cxx11::string::~string(local_1970);
    std::allocator<char>::~allocator(&local_1971);
    std::initializer_list<int>::initializer_list(&local_19b0);
    local_19c8 = 0;
    uStack_19c0 = 0;
    local_19b8 = 0;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x16ce11);
    __l_08._M_len._0_6_ = in_stack_ffffffffffffd560;
    __l_08._M_array = (iterator)in_stack_ffffffffffffd558;
    __l_08._M_len._6_1_ = in_stack_ffffffffffffd566;
    __l_08._M_len._7_1_ = in_stack_ffffffffffffd567;
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd550,__l_08);
    local_19e8 = 0;
    uStack_19e0 = 0;
    local_19d8 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x16ce64);
    GroupNS::Parameter::set
              (in_stack_ffffffffffffd580,
               (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd578,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffd570);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffd550);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd550);
    GroupNS::Group::parameter((Group *)in_stack_ffffffffffffd580,in_stack_ffffffffffffd578);
    GroupNS::Parameter::~Parameter(in_stack_ffffffffffffd540);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
             in_stack_ffffffffffffd570);
  bVar1 = isGroup((Parameters *)in_stack_ffffffffffffd558,in_stack_ffffffffffffd550);
  std::__cxx11::string::~string(local_1a08);
  std::allocator<char>::~allocator(&local_1a09);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    GroupNS::Group::Group
              ((Group *)CONCAT17(in_stack_ffffffffffffd567,
                                 CONCAT16(in_stack_ffffffffffffd566,in_stack_ffffffffffffd560)),
               &in_stack_ffffffffffffd558->_name,in_stack_ffffffffffffd550);
    group((Parameters *)in_stack_ffffffffffffd580,(Group *)in_stack_ffffffffffffd578);
    GroupNS::Group::~Group((Group *)in_stack_ffffffffffffd540);
    std::__cxx11::string::~string(local_1ab8);
    std::allocator<char>::~allocator(&local_1ab9);
    std::__cxx11::string::~string(local_1a90);
    std::allocator<char>::~allocator(&local_1a91);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
             in_stack_ffffffffffffd570);
  pGVar4 = group((Parameters *)in_stack_ffffffffffffd540,in_stack_ffffffffffffd538);
  std::__cxx11::string::~string(local_1ae8);
  std::allocator<char>::~allocator(&local_1ae9);
  local_1ac8 = pGVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
             in_stack_ffffffffffffd570);
  bVar1 = GroupNS::Group::isParameter(in_stack_ffffffffffffd558,in_stack_ffffffffffffd550);
  std::__cxx11::string::~string(local_1b10);
  std::allocator<char>::~allocator(&local_1b11);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    GroupNS::Parameter::Parameter
              ((Parameter *)
               CONCAT17(in_stack_ffffffffffffd567,
                        CONCAT16(in_stack_ffffffffffffd566,in_stack_ffffffffffffd560)),
               &in_stack_ffffffffffffd558->_name,in_stack_ffffffffffffd550);
    std::__cxx11::string::~string(local_1c10);
    std::allocator<char>::~allocator(&local_1c11);
    std::__cxx11::string::~string(local_1be8);
    std::allocator<char>::~allocator(&local_1be9);
    GroupNS::Parameter::set(in_stack_ffffffffffffd5c0,data);
    GroupNS::Group::parameter((Group *)in_stack_ffffffffffffd580,in_stack_ffffffffffffd578);
    GroupNS::Parameter::~Parameter(in_stack_ffffffffffffd540);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
             in_stack_ffffffffffffd570);
  bVar1 = GroupNS::Group::isParameter(in_stack_ffffffffffffd558,in_stack_ffffffffffffd550);
  std::__cxx11::string::~string(local_1c38);
  std::allocator<char>::~allocator(&local_1c39);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    GroupNS::Parameter::Parameter
              ((Parameter *)
               CONCAT17(in_stack_ffffffffffffd567,
                        CONCAT16(in_stack_ffffffffffffd566,in_stack_ffffffffffffd560)),
               &in_stack_ffffffffffffd558->_name,in_stack_ffffffffffffd550);
    std::__cxx11::string::~string(local_1d38);
    std::allocator<char>::~allocator(&local_1d39);
    std::__cxx11::string::~string(local_1d10);
    std::allocator<char>::~allocator(&local_1d11);
    std::initializer_list<int>::initializer_list(&local_1d50);
    local_1d68 = 0;
    uStack_1d60 = 0;
    local_1d58 = 0;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x16d70e);
    __l_09._M_len._0_6_ = in_stack_ffffffffffffd560;
    __l_09._M_array = (iterator)in_stack_ffffffffffffd558;
    __l_09._M_len._6_1_ = in_stack_ffffffffffffd566;
    __l_09._M_len._7_1_ = in_stack_ffffffffffffd567;
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd550,__l_09);
    local_1d88 = 0;
    uStack_1d80 = 0;
    local_1d78 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x16d761);
    GroupNS::Parameter::set
              (in_stack_ffffffffffffd580,
               (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd578,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffd570);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffd550);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd550);
    GroupNS::Group::parameter((Group *)in_stack_ffffffffffffd580,in_stack_ffffffffffffd578);
    GroupNS::Parameter::~Parameter(in_stack_ffffffffffffd540);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
             in_stack_ffffffffffffd570);
  bVar1 = GroupNS::Group::isParameter(in_stack_ffffffffffffd558,in_stack_ffffffffffffd550);
  std::__cxx11::string::~string(local_1da8);
  std::allocator<char>::~allocator(&local_1da9);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    GroupNS::Parameter::Parameter
              ((Parameter *)
               CONCAT17(in_stack_ffffffffffffd567,
                        CONCAT16(in_stack_ffffffffffffd566,in_stack_ffffffffffffd560)),
               &in_stack_ffffffffffffd558->_name,in_stack_ffffffffffffd550);
    std::__cxx11::string::~string(local_1ea8);
    std::allocator<char>::~allocator(&local_1ea9);
    std::__cxx11::string::~string(local_1e80);
    std::allocator<char>::~allocator(&local_1e81);
    local_1ec8 = 1;
    local_1ec4 = 0;
    local_1ec0 = &local_1ec8;
    local_1eb8 = 2;
    local_1ee8 = 0;
    uStack_1ee0 = 0;
    local_1ed8 = 0;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x16daa3);
    __l_10._M_len._0_6_ = in_stack_ffffffffffffd560;
    __l_10._M_array = (iterator)in_stack_ffffffffffffd558;
    __l_10._M_len._6_1_ = in_stack_ffffffffffffd566;
    __l_10._M_len._7_1_ = in_stack_ffffffffffffd567;
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd550,__l_10);
    local_1f08 = 0;
    uStack_1f00 = 0;
    local_1ef8 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x16daf6);
    GroupNS::Parameter::set
              (in_stack_ffffffffffffd580,
               (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd578,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffd570);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffd550);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd550);
    GroupNS::Group::parameter((Group *)in_stack_ffffffffffffd580,in_stack_ffffffffffffd578);
    GroupNS::Parameter::~Parameter(in_stack_ffffffffffffd540);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
             in_stack_ffffffffffffd570);
  bVar1 = GroupNS::Group::isParameter(in_stack_ffffffffffffd558,in_stack_ffffffffffffd550);
  std::__cxx11::string::~string(local_1f28);
  std::allocator<char>::~allocator(&local_1f29);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    GroupNS::Parameter::Parameter
              ((Parameter *)
               CONCAT17(in_stack_ffffffffffffd567,
                        CONCAT16(in_stack_ffffffffffffd566,in_stack_ffffffffffffd560)),
               &in_stack_ffffffffffffd558->_name,in_stack_ffffffffffffd550);
    std::__cxx11::string::~string(local_2028);
    std::allocator<char>::~allocator(&local_2029);
    std::__cxx11::string::~string(local_2000);
    std::allocator<char>::~allocator(&local_2001);
    std::initializer_list<double>::initializer_list(&local_2040);
    local_2058 = 0;
    uStack_2050 = 0;
    local_2048 = 0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x16de13);
    __l_11._M_len._0_6_ = in_stack_ffffffffffffd560;
    __l_11._M_array = (iterator)in_stack_ffffffffffffd558;
    __l_11._M_len._6_1_ = in_stack_ffffffffffffd566;
    __l_11._M_len._7_1_ = in_stack_ffffffffffffd567;
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd550,__l_11);
    local_2078 = 0;
    uStack_2070 = 0;
    local_2068 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x16de66);
    GroupNS::Parameter::set
              (in_stack_ffffffffffffd580,
               (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd578,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffd570);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffd550);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd550);
    GroupNS::Group::parameter((Group *)in_stack_ffffffffffffd580,in_stack_ffffffffffffd578);
    GroupNS::Parameter::~Parameter(in_stack_ffffffffffffd540);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
             in_stack_ffffffffffffd570);
  bVar1 = GroupNS::Group::isParameter(in_stack_ffffffffffffd558,in_stack_ffffffffffffd550);
  bVar2 = bVar1 ^ 0xff;
  std::__cxx11::string::~string(local_2098);
  std::allocator<char>::~allocator(&local_2099);
  if ((bVar2 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    GroupNS::Parameter::Parameter
              ((Parameter *)
               CONCAT17(in_stack_ffffffffffffd567,
                        CONCAT16(in_stack_ffffffffffffd566,in_stack_ffffffffffffd560)),
               &in_stack_ffffffffffffd558->_name,in_stack_ffffffffffffd550);
    std::__cxx11::string::~string(local_2198);
    std::allocator<char>::~allocator(&local_2199);
    std::__cxx11::string::~string(local_2170);
    std::allocator<char>::~allocator(&local_2171);
    std::initializer_list<double>::initializer_list(&local_21b0);
    local_21c8 = 0;
    uStack_21c0 = 0;
    local_21b8 = 0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x16e183);
    __l_12._M_len._0_6_ = in_stack_ffffffffffffd560;
    __l_12._M_array = (iterator)in_stack_ffffffffffffd558;
    __l_12._M_len._6_1_ = in_stack_ffffffffffffd566;
    __l_12._M_len._7_1_ = in_stack_ffffffffffffd567;
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd550,__l_12);
    local_21e8 = 0;
    uStack_21e0 = 0;
    local_21d8 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x16e1d6);
    GroupNS::Parameter::set
              (in_stack_ffffffffffffd580,
               (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd578,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffd570);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffd550);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd550);
    GroupNS::Group::parameter((Group *)in_stack_ffffffffffffd580,in_stack_ffffffffffffd578);
    GroupNS::Parameter::~Parameter(in_stack_ffffffffffffd540);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
             in_stack_ffffffffffffd570);
  bVar1 = GroupNS::Group::isParameter(in_stack_ffffffffffffd558,in_stack_ffffffffffffd550);
  std::__cxx11::string::~string(local_2208);
  std::allocator<char>::~allocator(&local_2209);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,
               in_stack_ffffffffffffd570);
    GroupNS::Parameter::Parameter
              ((Parameter *)
               CONCAT17(in_stack_ffffffffffffd567,
                        CONCAT16(in_stack_ffffffffffffd566,in_stack_ffffffffffffd560)),
               &in_stack_ffffffffffffd558->_name,in_stack_ffffffffffffd550);
    std::__cxx11::string::~string(local_2308);
    std::allocator<char>::~allocator(&local_2309);
    std::__cxx11::string::~string(local_22e0);
    std::allocator<char>::~allocator(&local_22e1);
    std::initializer_list<int>::initializer_list((initializer_list<int> *)(local_2328 + 8));
    local_2358._32_8_ = 0;
    sStack_2330 = 0;
    local_2328._0_8_ = 0;
    in_stack_ffffffffffffd580 = (Parameter *)(local_2358 + 0x20);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x16e4cc);
    __l_13._M_len._0_6_ = in_stack_ffffffffffffd560;
    __l_13._M_array = (iterator)in_stack_ffffffffffffd558;
    __l_13._M_len._6_1_ = in_stack_ffffffffffffd566;
    __l_13._M_len._7_1_ = in_stack_ffffffffffffd567;
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd550,__l_13);
    local_2358._0_8_ = 0;
    local_2358._8_8_ = 0;
    local_2358._16_8_ = 0;
    in_stack_ffffffffffffd578 = (Parameter *)local_2358;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x16e516);
    GroupNS::Parameter::set
              (in_stack_ffffffffffffd580,
               (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd578,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffd570);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffd550);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd550);
    GroupNS::Group::parameter((Group *)in_stack_ffffffffffffd580,in_stack_ffffffffffffd578);
    GroupNS::Parameter::~Parameter(in_stack_ffffffffffffd540);
  }
  __a = &local_2379;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,__a);
  uVar3 = GroupNS::Group::isParameter(in_stack_ffffffffffffd558,in_stack_ffffffffffffd550);
  bVar2 = uVar3 ^ 0xff;
  std::__cxx11::string::~string(local_2378);
  std::allocator<char>::~allocator(&local_2379);
  if ((bVar2 & 1) != 0) {
    name = (string *)local_2451;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,__a);
    description = (string *)local_2479;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffd580->_name,(char *)in_stack_ffffffffffffd578,__a);
    GroupNS::Parameter::Parameter
              ((Parameter *)CONCAT17(uVar3,CONCAT16(bVar2,in_stack_ffffffffffffd560)),name,
               description);
    std::__cxx11::string::~string((string *)(local_2479 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_2479);
    std::__cxx11::string::~string((string *)(local_2451 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_2451);
    std::initializer_list<double>::initializer_list((initializer_list<double> *)(local_24a8 + 0x18))
    ;
    local_24a8._0_8_ = 0;
    local_24a8._8_8_ = 0;
    local_24a8._16_8_ = 0;
    this_00 = (Parameter *)local_24a8;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x16e806);
    __l_14._M_len._0_6_ = in_stack_ffffffffffffd560;
    __l_14._M_array = (iterator)name;
    __l_14._M_len._6_1_ = bVar2;
    __l_14._M_len._7_1_ = uVar3;
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)description,__l_14);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x16e84f);
    GroupNS::Parameter::set
              (in_stack_ffffffffffffd580,
               (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd578,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)__a);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)description);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)description);
    GroupNS::Group::parameter((Group *)in_stack_ffffffffffffd580,in_stack_ffffffffffffd578);
    GroupNS::Parameter::~Parameter(this_00);
  }
  return;
}

Assistant:

void ezc3d::ParametersNS::Parameters::setMandatoryParameters() {
  // Mandatory groups
  {
    if (!isGroup("POINT")) {
      group(ezc3d::ParametersNS::GroupNS::Group("POINT"));
    }

    ezc3d::ParametersNS::GroupNS::Group &grp(group("POINT"));
    if (!grp.isParameter("USED")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("USED", "");
      p.set(0);
      p.lock();
      grp.parameter(p);
    }
    if (!grp.isParameter("LABELS")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("LABELS", "");
      p.set(std::vector<std::string>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("DESCRIPTIONS")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("DESCRIPTIONS", "");
      p.set(std::vector<std::string>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("SCALE")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("SCALE", "");
      p.set(-1.0);
      p.lock();
      grp.parameter(p);
    }
    if (!grp.isParameter("UNITS")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("UNITS", "");
      p.set(std::vector<std::string>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("RATE")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("RATE", "");
      p.set(0.0);
      p.lock();
      grp.parameter(p);
    }
    if (!grp.isParameter("DATA_START")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("DATA_START", "");
      p.set(0);
      p.lock();
      grp.parameter(p);
    }
    if (!grp.isParameter("FRAMES")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("FRAMES", "");
      p.set(0);
      p.lock();
      grp.parameter(p);
    }
  }
  {
    if (!isGroup("ANALOG")) {
      group(ezc3d::ParametersNS::GroupNS::Group("ANALOG"));
    }

    ezc3d::ParametersNS::GroupNS::Group &grp(group("ANALOG"));
    if (!grp.isParameter("USED")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("USED", "");
      p.set(0);
      p.lock();
      grp.parameter(p);
    }
    if (!grp.isParameter("LABELS")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("LABELS", "");
      p.set(std::vector<std::string>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("DESCRIPTIONS")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("DESCRIPTIONS", "");
      p.set(std::vector<std::string>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("GEN_SCALE")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("GEN_SCALE", "");
      p.set(1.0);
      grp.parameter(p);
    }
    if (!grp.isParameter("SCALE")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("SCALE", "");
      p.set(std::vector<double>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("OFFSET")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("OFFSET", "");
      p.set(std::vector<int>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("UNITS")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("UNITS", "");
      p.set(std::vector<std::string>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("RATE")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("RATE", "");
      p.set(0.0);
      p.lock();
      grp.parameter(p);
    }
    if (!grp.isParameter("FORMAT")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("FORMAT", "");
      p.set(std::vector<std::string>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("BITS")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("BITS", "");
      p.set(std::vector<int>() = {});
      grp.parameter(p);
    }
  }
  {
    if (!isGroup("FORCE_PLATFORM")) {
      group(ezc3d::ParametersNS::GroupNS::Group("FORCE_PLATFORM"));
    }

    ezc3d::ParametersNS::GroupNS::Group &grp(group("FORCE_PLATFORM"));
    if (!grp.isParameter("USED")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("USED", "");
      p.set(0);
      grp.parameter(p);
    }
    if (!grp.isParameter("TYPE")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("TYPE", "");
      p.set(std::vector<int>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("ZERO")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("ZERO", "");
      p.set(std::vector<int>() = {1, 0});
      grp.parameter(p);
    }
    if (!grp.isParameter("CORNERS")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("CORNERS", "");
      p.set(std::vector<double>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("ORIGIN")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("ORIGIN", "");
      p.set(std::vector<double>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("CHANNEL")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("CHANNEL", "");
      p.set(std::vector<int>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("CAL_MATRIX")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("CAL_MATRIX", "");
      p.set(std::vector<double>() = {});
      grp.parameter(p);
    }
  }
}